

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O0

char * __thiscall cmCacheManager::CacheEntry::GetProperty(CacheEntry *this,string *prop)

{
  bool bVar1;
  string *prop_local;
  CacheEntry *this_local;
  
  bVar1 = std::operator==(prop,"TYPE");
  if (bVar1) {
    this_local = (CacheEntry *)cmState::CacheEntryTypeToString(this->Type);
  }
  else {
    bVar1 = std::operator==(prop,"VALUE");
    if (bVar1) {
      this_local = (CacheEntry *)std::__cxx11::string::c_str();
    }
    else {
      this_local = (CacheEntry *)cmPropertyMap::GetPropertyValue(&this->Properties,prop);
    }
  }
  return (char *)this_local;
}

Assistant:

const char*
cmCacheManager::CacheEntry::GetProperty(const std::string& prop) const
{
  if(prop == "TYPE")
    {
    return cmState::CacheEntryTypeToString(this->Type);
    }
  else if(prop == "VALUE")
    {
    return this->Value.c_str();
    }
  return this->Properties.GetPropertyValue(prop);
}